

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O2

defyx_cache * defyx_alloc_cache(defyx_flags flags)

{
  defyx_cache *cache;
  JitCompilerX86 *pJVar1;
  uint8_t *puVar2;
  defyx_cache *pdVar3;
  long lVar4;
  int extraout_EDX;
  size_t size;
  code *UNRECOVERED_JUMPTABLE;
  void *unaff_R12;
  ulong uVar5;
  
  cache = (defyx_cache *)operator_new(0x2130);
  size = 0;
  pdVar3 = cache;
  memset(cache,0,0x2130);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)&(cache->cacheKey).field_2;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  uVar5 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = defyx::initCache;
    cache->datasetInit = defyx::initDataset;
    puVar2 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = defyx::initCache;
    cache->datasetInit = defyx::initDataset;
    puVar2 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
    break;
  default:
    operator_delete(unaff_R12);
    if (extraout_EDX == 1) {
      __cxa_begin_catch(&switchD_0011a03a::switchdataD_0012d6e0);
      if (cache != (defyx_cache *)0x0) {
        defyx_release_cache(cache);
      }
      __cxa_end_catch();
      return (defyx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_0011a03a::switchdataD_0012d6e0);
  case RANDOMX_FLAG_JIT:
    cache->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = defyx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = defyx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    pdVar3 = (defyx_cache *)(*UNRECOVERED_JUMPTABLE)();
    return pdVar3;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = (char)(&switchD_0011a03a::switchdataD_0012d6e0)[uVar5] + -0xc;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    pdVar3 = (defyx_cache *)
             defyx::CompiledLightVm<defyx::LargePageAllocator,true>::operator_new
                       ((CompiledLightVm<defyx::LargePageAllocator,true> *)pdVar3,size);
    memset(pdVar3,0,0x480);
    defyx::CompiledLightVm<defyx::LargePageAllocator,_true>::CompiledLightVm
              ((CompiledLightVm<defyx::LargePageAllocator,_true> *)pdVar3);
    goto LAB_0011a66d;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    pdVar3 = (defyx_cache *)
             defyx::CompiledVm<defyx::LargePageAllocator,false>::operator_new
                       ((CompiledVm<defyx::LargePageAllocator,false> *)pdVar3,size);
    memset(pdVar3,0,0x480);
    defyx::CompiledVm<defyx::LargePageAllocator,_false>::CompiledVm
              ((CompiledVm<defyx::LargePageAllocator,_false> *)pdVar3);
    goto LAB_0011a66d;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    pdVar3 = (defyx_cache *)
             defyx::CompiledLightVm<defyx::LargePageAllocator,false>::operator_new
                       ((CompiledLightVm<defyx::LargePageAllocator,false> *)pdVar3,size);
    memset(pdVar3,0,0x480);
    defyx::CompiledLightVm<defyx::LargePageAllocator,_false>::CompiledLightVm
              ((CompiledLightVm<defyx::LargePageAllocator,_false> *)pdVar3);
LAB_0011a66d:
    lVar4 = *(long *)&pdVar3->memory;
    if (uVar5 != 0) {
      (**(code **)(lVar4 + 0x28))(pdVar3,uVar5);
      std::__cxx11::string::_M_assign((string *)(pdVar3->programs[0].programBuffer + 0x7c));
      lVar4 = *(long *)&pdVar3->memory;
    }
    if (cache != (defyx_cache *)0x0) {
      (**(code **)(lVar4 + 0x20))(pdVar3,cache);
      lVar4 = *(long *)&pdVar3->memory;
    }
    (**(code **)(lVar4 + 0x10))(pdVar3);
    return pdVar3;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = (char)(&switchD_0011a03a::switchdataD_0012d6e0)[uVar5] + -0xc;
    halt_baddata();
  }
  cache->memory = puVar2;
  return cache;
}

Assistant:

defyx_cache *defyx_alloc_cache(defyx_flags flags) {
		defyx_cache *cache;

		try {
			cache = new defyx_cache();
			switch (flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES)) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				defyx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}